

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_8x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar4;
  ushort uVar5;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  undefined1 auVar6 [16];
  ushort uVar19;
  ushort uVar20;
  __m128i weights;
  __m128i left;
  __m128i top_right;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_px;
  undefined4 local_3cc;
  undefined8 local_338;
  undefined1 local_298;
  undefined1 uStack_297;
  undefined1 uStack_296;
  undefined1 uStack_295;
  undefined1 uStack_294;
  undefined1 uStack_293;
  undefined1 uStack_292;
  undefined1 uStack_291;
  undefined2 uStack_266;
  undefined2 uStack_264;
  undefined2 uStack_262;
  undefined2 uStack_25e;
  undefined2 uStack_25c;
  undefined2 uStack_25a;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i round;
  __m128i scaled_top_right;
  __m128i inverted_weights;
  __m128i scale;
  
  bVar2 = *(byte *)(in_RDX + 7);
  uVar1 = *in_RCX;
  local_298 = (byte)uVar1;
  uStack_297 = (undefined1)((ulong)uVar1 >> 8);
  uStack_296 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_295 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_294 = (byte)((ulong)uVar1 >> 0x20);
  uStack_293 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_292 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_291 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_266 = (ushort)bVar2;
  uStack_264 = (ushort)bVar2;
  uStack_262 = (ushort)bVar2;
  uStack_25e = (ushort)bVar2;
  uStack_25c = (ushort)bVar2;
  uStack_25a = (ushort)bVar2;
  local_338 = in_RDI;
  for (local_3cc = 0x1000100; local_3cc < 0xf0e0f0f; local_3cc = local_3cc + 0x2020202) {
    auVar6._4_4_ = local_3cc;
    auVar6._0_4_ = local_3cc;
    auVar6._12_4_ = local_3cc;
    auVar6._8_4_ = local_3cc;
    auVar3[1] = 0;
    auVar3[0] = local_298;
    auVar3[2] = uStack_297;
    auVar3[3] = 0;
    auVar3[4] = uStack_296;
    auVar3[5] = 0;
    auVar3[6] = uStack_295;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = uStack_294;
    auVar3[10] = uStack_293;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_292;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_291;
    auVar3[0xf] = 0;
    auVar6 = pshufb(auVar3,auVar6);
    round[1]._0_2_ = auVar6._0_2_;
    round[1]._2_2_ = auVar6._2_2_;
    round[1]._4_2_ = auVar6._4_2_;
    round[1]._6_2_ = auVar6._6_2_;
    scaled_top_right[0]._0_2_ = auVar6._8_2_;
    scaled_top_right[0]._2_2_ = auVar6._10_2_;
    scaled_top_right[0]._4_2_ = auVar6._12_2_;
    scaled_top_right[0]._6_2_ = auVar6._14_2_;
    uVar4 = (ushort)bVar2 + (short)round[1] * 0xff + 0x80;
    uVar7 = uStack_266 * 0x3b + round[1]._2_2_ * 0xc5 + 0x80;
    uVar9 = uStack_264 * 0x6e + round[1]._4_2_ * 0x92 + 0x80;
    uVar11 = uStack_262 * 0x97 + round[1]._6_2_ * 0x69 + 0x80;
    uVar13 = (ushort)bVar2 * 0xb7 + (short)scaled_top_right[0] * 0x49 + 0x80;
    uVar15 = uStack_25e * 0xce + scaled_top_right[0]._2_2_ * 0x32 + 0x80;
    uVar17 = uStack_25c * 0xdb + scaled_top_right[0]._4_2_ * 0x25 + 0x80;
    uVar19 = uStack_25a * 0xe0 + scaled_top_right[0]._6_2_ * 0x20 + 0x80;
    uVar5 = uVar4 >> 8;
    uVar8 = uVar7 >> 8;
    uVar10 = uVar9 >> 8;
    uVar12 = uVar11 >> 8;
    uVar14 = uVar13 >> 8;
    uVar16 = uVar15 >> 8;
    uVar18 = uVar17 >> 8;
    uVar20 = uVar19 >> 8;
    *local_338 = CONCAT17((uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20),
                          CONCAT16((uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) -
                                   (0xff < uVar18),
                                   CONCAT15((uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar15 >> 8) -
                                            (0xff < uVar16),
                                            CONCAT14((uVar14 != 0) * (uVar14 < 0x100) *
                                                     (char)(uVar13 >> 8) - (0xff < uVar14),
                                                     CONCAT13((uVar12 != 0) * (uVar12 < 0x100) *
                                                              (char)(uVar11 >> 8) - (0xff < uVar12),
                                                              CONCAT12((uVar10 != 0) *
                                                                       (uVar10 < 0x100) *
                                                                       (char)(uVar9 >> 8) -
                                                                       (0xff < uVar10),
                                                                       CONCAT11((uVar8 != 0) *
                                                                                (uVar8 < 0x100) *
                                                                                (char)(uVar7 >> 8) -
                                                                                (0xff < uVar8),
                                                                                (uVar5 != 0) *
                                                                                (uVar5 < 0x100) *
                                                                                (char)(uVar4 >> 8) -
                                                                                (0xff < uVar5)))))))
                         );
    local_338 = (undefined8 *)(in_RSI + (long)local_338);
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_8x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[7]);
  const __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
}